

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

uint64_t MercuryJson::extract_pseudo_structural_mask
                   (uint64_t structural_mask,uint64_t whitespace_mask,uint64_t quote_mask,
                   uint64_t literal_mask,uint64_t *prev_pseudo_structural_end_mask)

{
  ulong uVar1;
  uint64_t pseudo_structural_mask;
  uint64_t st_ws;
  uint64_t *prev_pseudo_structural_end_mask_local;
  uint64_t literal_mask_local;
  uint64_t quote_mask_local;
  uint64_t whitespace_mask_local;
  uint64_t structural_mask_local;
  
  uVar1 = *prev_pseudo_structural_end_mask;
  *prev_pseudo_structural_end_mask = (structural_mask | whitespace_mask) >> 0x3f;
  return (quote_mask & (literal_mask ^ 0xffffffffffffffff) ^ 0xffffffffffffffff) &
         ((whitespace_mask ^ 0xffffffffffffffff) & (literal_mask ^ 0xffffffffffffffff) &
          ((structural_mask | whitespace_mask) << 1 | uVar1) | quote_mask | structural_mask);
}

Assistant:

uint64_t extract_pseudo_structural_mask(
            uint64_t structural_mask, uint64_t whitespace_mask, uint64_t quote_mask, uint64_t literal_mask,
            uint64_t *prev_pseudo_structural_end_mask) {
        uint64_t st_ws = structural_mask | whitespace_mask;
        structural_mask |= quote_mask;
        uint64_t pseudo_structural_mask = (st_ws << 1U) | *prev_pseudo_structural_end_mask;
        *prev_pseudo_structural_end_mask = st_ws >> 63U;
        pseudo_structural_mask &= (~whitespace_mask) & (~literal_mask);
        structural_mask |= pseudo_structural_mask;
        structural_mask &= ~(quote_mask & ~literal_mask);
        return structural_mask;
    }